

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

Float __thiscall pbrt::PiecewiseLinearSpectrum::MaxValue(PiecewiseLinearSpectrum *this)

{
  size_t sVar1;
  float *pfVar2;
  
  sVar1 = (this->values).nStored;
  if (sVar1 != 0) {
    pfVar2 = (this->values).ptr;
    pfVar2 = std::__max_element<float_const*,__gnu_cxx::__ops::_Iter_less_iter>
                       (pfVar2,pfVar2 + sVar1);
    return *pfVar2;
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU
    bool empty() const { return size() == 0; }